

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t default_read_chunk(exr_decode_pipeline_t *decode)

{
  char *pcVar1;
  long lVar2;
  long in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  undefined4 in_stack_00000010;
  exr_result_t rv;
  int in_stack_00000024;
  exr_const_context_t in_stack_00000028;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar3;
  
  pcVar1 = *(char **)(in_RDI + 0x10);
  if (pcVar1 == (char *)0x0) {
    eVar3 = 2;
  }
  else if (*pcVar1 == '\0') {
    if ((*(int *)(in_RDI + 0xc) < 0) || (*(int *)(pcVar1 + 0xc4) <= *(int *)(in_RDI + 0xc))) {
      eVar3 = (**(code **)(pcVar1 + 0x48))
                        (pcVar1,4,"Part index (%d) out of range",*(undefined4 *)(in_RDI + 0xc));
    }
    else {
      lVar2 = *(long *)(*(long *)(pcVar1 + 0x1d8) + (long)*(int *)(in_RDI + 0xc) * 8);
      if ((*(long *)(in_RDI + 0x70) == *(long *)(in_RDI + 0x60)) && (*(long *)(in_RDI + 0x78) == 0))
      {
        *(undefined8 *)(in_RDI + 0x70) = 0;
      }
      if ((*(int *)(lVar2 + 4) == 2) || (*(int *)(lVar2 + 4) == 3)) {
        eVar3 = internal_decode_alloc_buffer
                          (decode,rv,(void **)pctxt,(size_t *)part,
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        if (eVar3 == 0) {
          if ((*(ushort *)(in_RDI + 10) & 4) == 0) {
            eVar3 = internal_decode_alloc_buffer
                              (decode,rv,(void **)pctxt,(size_t *)part,
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
            if (eVar3 == 0) {
              eVar3 = exr_read_deep_chunk(in_stack_00000028,in_stack_00000024,
                                          (exr_chunk_info_t *)decode,
                                          (void *)CONCAT44(rv,in_stack_00000010),pctxt);
            }
          }
          else {
            eVar3 = exr_read_deep_chunk(in_stack_00000028,in_stack_00000024,
                                        (exr_chunk_info_t *)decode,
                                        (void *)CONCAT44(rv,in_stack_00000010),pctxt);
          }
        }
      }
      else {
        eVar3 = internal_decode_alloc_buffer
                          (decode,rv,(void **)pctxt,(size_t *)part,
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        if (eVar3 == 0) {
          eVar3 = exr_read_chunk(in_stack_00000028,in_stack_00000024,(exr_chunk_info_t *)decode,
                                 (void *)CONCAT44(rv,in_stack_00000010));
        }
      }
    }
  }
  else {
    eVar3 = (**(code **)(pcVar1 + 0x38))(pcVar1,7);
  }
  return eVar3;
}

Assistant:

static exr_result_t
default_read_chunk (exr_decode_pipeline_t* decode)
{
    exr_result_t rv;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (
        decode->context, decode->part_index);

    if (decode->unpacked_buffer == decode->packed_buffer &&
        decode->unpacked_alloc_size == 0)
        decode->unpacked_buffer = NULL;

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        rv = internal_decode_alloc_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
            &(decode->packed_sample_count_table),
            &(decode->packed_sample_count_alloc_size),
            decode->chunk.sample_count_table_size);
        if (rv != EXR_ERR_SUCCESS) return rv;

        if ((decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY))
        {
            rv = exr_read_deep_chunk (
                decode->context,
                decode->part_index,
                &(decode->chunk),
                NULL,
                decode->packed_sample_count_table);
        }
        else
        {
            rv = internal_decode_alloc_buffer (
                decode,
                EXR_TRANSCODE_BUFFER_PACKED,
                (void**) &(decode->packed_buffer),
                &(decode->packed_alloc_size),
                decode->chunk.packed_size);
            if (rv != EXR_ERR_SUCCESS) return rv;

            rv = exr_read_deep_chunk (
                decode->context,
                decode->part_index,
                &(decode->chunk),
                decode->packed_buffer,
                decode->packed_sample_count_table);
        }
    }
    else
    {
        rv = internal_decode_alloc_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED,
            (void**) &(decode->packed_buffer),
            &(decode->packed_alloc_size),
            decode->chunk.packed_size);
        if (rv != EXR_ERR_SUCCESS) return rv;
        rv = exr_read_chunk (
            decode->context,
            decode->part_index,
            &(decode->chunk),
            decode->packed_buffer);
    }

    return rv;
}